

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

ENDPOINT_HANDLE connection_create_endpoint(CONNECTION_HANDLE connection)

{
  size_t __size;
  uint uVar1;
  ENDPOINT_HANDLE __ptr;
  ENDPOINT_INSTANCE **ppEVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (connection == (CONNECTION_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar6 = "NULL connection";
      iVar4 = 0x743;
LAB_0014d914:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                ,"connection_create_endpoint",iVar4,1,pcVar6);
      return (ENDPOINT_HANDLE)0x0;
    }
  }
  else {
    uVar1 = connection->endpoint_count;
    uVar8 = (ulong)uVar1;
    if (uVar1 < connection->channel_max) {
      uVar5 = 0;
      if (uVar8 != 0) {
        uVar7 = 0;
        do {
          uVar5 = uVar7;
          if ((uint)uVar7 < (uint)connection->endpoints[uVar7]->outgoing_channel) break;
          uVar7 = uVar7 + 1;
          uVar5 = uVar8;
        } while (uVar1 != (uint)uVar7);
      }
      __ptr = (ENDPOINT_HANDLE)calloc(1,0x28);
      if (__ptr == (ENDPOINT_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar6 = "Cannot allocate memory for endpoint";
          iVar4 = 0x760;
          goto LAB_0014d914;
        }
      }
      else {
        __ptr->outgoing_channel = (uint16_t)uVar5;
        __ptr->connection = connection;
        __size = uVar8 * 8 + 8;
        ppEVar2 = (ENDPOINT_INSTANCE **)realloc(connection->endpoints,__size);
        if (ppEVar2 != (ENDPOINT_INSTANCE **)0x0) {
          connection->endpoints = ppEVar2;
          uVar8 = uVar5 & 0xffffffff;
          if ((uint)uVar5 < connection->endpoint_count) {
            uVar5 = connection->endpoint_count - uVar8;
            if (uVar5 >> 0x3d == 0) {
              memmove(ppEVar2 + uVar8 + 1,ppEVar2 + uVar8,uVar5 * 8);
            }
            else {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                          ,"connection_create_endpoint",0x784,1,"Cannot memmove endpoints, size:%zu"
                          ,0xffffffffffffffff);
              }
            }
          }
          connection->endpoints[uVar8] = __ptr;
          connection->endpoint_count = connection->endpoint_count + 1;
          return __ptr;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                    ,"connection_create_endpoint",0x773,1,
                    "Cannot reallocate memory for connection endpoints, size:%zu",__size);
        }
        free(__ptr);
      }
    }
  }
  return (ENDPOINT_HANDLE)0x0;
}

Assistant:

ENDPOINT_HANDLE connection_create_endpoint(CONNECTION_HANDLE connection)
{
    ENDPOINT_HANDLE result;

    /* Codes_S_R_S_CONNECTION_01_113: [If connection, on_endpoint_frame_received or on_connection_state_changed is NULL, connection_create_endpoint shall fail and return NULL.] */
    /* Codes_S_R_S_CONNECTION_01_193: [The context argument shall be allowed to be NULL.] */
    if (connection == NULL)
    {
        LogError("NULL connection");
        result = NULL;
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_115: [If no more endpoints can be created due to all channels being used, connection_create_endpoint shall fail and return NULL.] */
        if (connection->endpoint_count >= connection->channel_max)
        {
            result = NULL;
        }
        else
        {
            uint32_t i = 0;

            /* Codes_S_R_S_CONNECTION_01_128: [The lowest number outgoing channel shall be associated with the newly created endpoint.] */
            for (i = 0; i < connection->endpoint_count; i++)
            {
                if (connection->endpoints[i]->outgoing_channel > i)
                {
                    /* found a gap in the sorted endpoint array */
                    break;
                }
            }

            /* Codes_S_R_S_CONNECTION_01_127: [On success, connection_create_endpoint shall return a non-NULL handle to the newly created endpoint.] */
            result = (ENDPOINT_HANDLE)calloc(1, sizeof(ENDPOINT_INSTANCE));
            /* Codes_S_R_S_CONNECTION_01_196: [If memory cannot be allocated for the new endpoint, connection_create_endpoint shall fail and return NULL.] */
            if (result == NULL)
            {
                LogError("Cannot allocate memory for endpoint");
            }
            else
            {
                ENDPOINT_HANDLE* new_endpoints;

                result->on_endpoint_frame_received = NULL;
                result->on_connection_state_changed = NULL;
                result->callback_context = NULL;
                result->outgoing_channel = (uint16_t)i;
                result->connection = connection;

                /* Codes_S_R_S_CONNECTION_01_197: [The newly created endpoint shall be added to the endpoints list, so that it can be tracked.] */
                size_t realloc_size = safe_add_size_t((size_t)connection->endpoint_count, 1);
                realloc_size = safe_multiply_size_t(realloc_size, sizeof(ENDPOINT_HANDLE));
                if (realloc_size == SIZE_MAX ||
                    (new_endpoints = (ENDPOINT_HANDLE*)realloc(connection->endpoints, realloc_size)) == NULL)
                {
                    /* Tests_S_R_S_CONNECTION_01_198: [If adding the endpoint to the endpoints list tracked by the connection fails, connection_create_endpoint shall fail and return NULL.] */
                    LogError("Cannot reallocate memory for connection endpoints, size:%zu", realloc_size);
                    free(result);
                    result = NULL;
                }
                else
                {
                    connection->endpoints = new_endpoints;

                    if (i < connection->endpoint_count)
                    {
                        size_t memmove_size = safe_multiply_size_t(safe_subtract_size_t(connection->endpoint_count, i), sizeof(ENDPOINT_INSTANCE*));
                        if (memmove_size != SIZE_MAX)
                        {
                            (void)memmove(&connection->endpoints[i + 1], &connection->endpoints[i], memmove_size);
                        }
                        else
                        {
                            LogError("Cannot memmove endpoints, size:%zu", memmove_size);
                        }
                    }

                    connection->endpoints[i] = result;
                    connection->endpoint_count++;

                    /* Codes_S_R_S_CONNECTION_01_112: [connection_create_endpoint shall create a new endpoint that can be used by a session.] */
                }
            }
        }
    }

    return result;
}